

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O2

QStringList *
QStandardPaths::standardLocations(QStringList *__return_storage_ptr__,StandardLocation type)

{
  pointer pQVar1;
  int i_1;
  int i;
  ulong uVar2;
  int i_3;
  long lVar3;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<QString,_QLatin1String> local_78;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  switch(type) {
  case FontsLocation:
    QDir::homePath();
    local_78.a.d.size = local_98.size;
    local_78.a.d.ptr = local_98.ptr;
    local_78.a.d.d = local_98.d;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    local_78.b.m_size = 7;
    local_78.b.m_data = "/.fonts";
    QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&local_50,&local_78);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    xdgDataDirs();
    QList<QString>::append(__return_storage_ptr__,(QList<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    lVar3 = 0x18;
    for (uVar2 = 1; uVar2 < (ulong)(__return_storage_ptr__->d).size; uVar2 = uVar2 + 1) {
      pQVar1 = QList<QString>::data(__return_storage_ptr__);
      str_00.m_data = "/fonts";
      str_00.m_size = 6;
      QString::append((QString *)((long)&(pQVar1->d).d + lVar3),str_00);
      lVar3 = lVar3 + 0x18;
    }
    break;
  case ApplicationsLocation:
    xdgDataDirs();
    QArrayDataPointer<QString>::operator=
              (&__return_storage_ptr__->d,(QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < (ulong)(__return_storage_ptr__->d).size; uVar2 = uVar2 + 1) {
      pQVar1 = QList<QString>::data(__return_storage_ptr__);
      str.m_data = "/applications";
      str.m_size = 0xd;
      QString::append((QString *)((long)&(pQVar1->d).d + lVar3),str);
      lVar3 = lVar3 + 0x18;
    }
    break;
  case AppLocalDataLocation:
  case AppDataLocation:
    xdgDataDirs();
    QArrayDataPointer<QString>::operator=
              (&__return_storage_ptr__->d,(QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < (ulong)(__return_storage_ptr__->d).size; uVar2 = uVar2 + 1) {
      pQVar1 = QList<QString>::data(__return_storage_ptr__);
      appendOrganizationAndApp((QString *)((long)&(pQVar1->d).d + lVar3));
      lVar3 = lVar3 + 0x18;
    }
    break;
  case GenericDataLocation:
    xdgDataDirs();
    goto LAB_003e84fb;
  case ConfigLocation:
  case GenericConfigLocation:
    xdgConfigDirs();
LAB_003e84fb:
    QArrayDataPointer<QString>::operator=
              (&__return_storage_ptr__->d,(QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    break;
  case AppConfigLocation:
    xdgConfigDirs();
    QArrayDataPointer<QString>::operator=
              (&__return_storage_ptr__->d,(QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < (ulong)(__return_storage_ptr__->d).size; uVar2 = uVar2 + 1) {
      pQVar1 = QList<QString>::data(__return_storage_ptr__);
      appendOrganizationAndApp((QString *)((long)&(pQVar1->d).d + lVar3));
      lVar3 = lVar3 + 0x18;
    }
  }
  local_78.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  writableLocation(&local_78.a,type);
  QList<QString>::emplaceFront<QString_const&>(__return_storage_ptr__,&local_78.a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QStandardPaths::standardLocations(StandardLocation type)
{
    QStringList dirs;
    switch (type) {
    case ConfigLocation:
    case GenericConfigLocation:
        dirs = xdgConfigDirs();
        break;
    case AppConfigLocation:
        dirs = xdgConfigDirs();
        for (int i = 0; i < dirs.size(); ++i)
            appendOrganizationAndApp(dirs[i]);
        break;
    case GenericDataLocation:
        dirs = xdgDataDirs();
        break;
    case ApplicationsLocation:
        dirs = xdgDataDirs();
        for (int i = 0; i < dirs.size(); ++i)
            dirs[i].append("/applications"_L1);
        break;
    case AppDataLocation:
    case AppLocalDataLocation:
        dirs = xdgDataDirs();
        for (int i = 0; i < dirs.size(); ++i)
            appendOrganizationAndApp(dirs[i]);
        break;
    case FontsLocation:
        dirs += QDir::homePath() + "/.fonts"_L1;
        dirs += xdgDataDirs();
        for (int i = 1; i < dirs.size(); ++i)
            dirs[i].append("/fonts"_L1);
        break;
    default:
        break;
    }
    const QString localDir = writableLocation(type);
    dirs.prepend(localDir);
    return dirs;
}